

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_logger.cpp
# Opt level: O3

void __thiscall cppnet::BaseLogger::~BaseLogger(BaseLogger *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  SetLevel(this,LL_NULL);
  p_Var1 = (this->_logger).super___shared_ptr<cppnet::Logger,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  std::_Deque_base<cppnet::Log_*,_std::allocator<cppnet::Log_*>_>::~_Deque_base
            ((_Deque_base<cppnet::Log_*,_std::allocator<cppnet::Log_*>_> *)
             &(this->_cache_queue)._queue);
  p_Var1 = (this->_allocter).super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    return;
  }
  return;
}

Assistant:

BaseLogger::~BaseLogger() {
    SetLevel(LL_NULL);
}